

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionShape.cpp
# Opt level: O0

void __thiscall
btCollisionShape::calculateTemporalAabb
          (btCollisionShape *this,btTransform *curTrans,btVector3 *linvel,btVector3 *angvel,
          btScalar timeStep,btVector3 *temporalAabbMin,btVector3 *temporalAabbMax)

{
  btScalar *pbVar1;
  undefined8 in_RSI;
  long *in_RDI;
  btVector3 *in_R8;
  btVector3 *in_R9;
  float in_XMM0_Da;
  btScalar bVar2;
  float fVar3;
  btVector3 angularMotion3d;
  btScalar angularMotion;
  btVector3 linMotion;
  btScalar temporalAabbMinz;
  btScalar temporalAabbMiny;
  btScalar temporalAabbMinx;
  btScalar temporalAabbMaxz;
  btScalar temporalAabbMaxy;
  btScalar temporalAabbMaxx;
  undefined4 in_stack_ffffffffffffff68;
  btScalar in_stack_ffffffffffffff6c;
  btScalar in_stack_ffffffffffffff70;
  btScalar in_stack_ffffffffffffff74;
  btScalar bStack_88;
  btVector3 local_84;
  btVector3 local_74;
  float local_64;
  btVector3 local_60;
  btScalar local_50;
  btScalar local_4c;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btVector3 *local_38;
  btVector3 *local_30;
  float local_24;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_XMM0_Da;
  (**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI,in_R8,in_R9);
  pbVar1 = btVector3::getX(local_38);
  local_3c = *pbVar1;
  pbVar1 = btVector3::getY(local_38);
  local_40 = *pbVar1;
  pbVar1 = btVector3::getZ(local_38);
  local_44 = *pbVar1;
  pbVar1 = btVector3::getX(local_30);
  local_48 = *pbVar1;
  pbVar1 = btVector3::getY(local_30);
  local_4c = *pbVar1;
  pbVar1 = btVector3::getZ(local_30);
  local_50 = *pbVar1;
  local_60 = ::operator*((btVector3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (btScalar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  pbVar1 = btVector3::x(&local_60);
  if (*pbVar1 <= 0.0) {
    pbVar1 = btVector3::x(&local_60);
    local_48 = *pbVar1 + local_48;
  }
  else {
    pbVar1 = btVector3::x(&local_60);
    local_3c = *pbVar1 + local_3c;
  }
  pbVar1 = btVector3::y(&local_60);
  if (*pbVar1 <= 0.0) {
    pbVar1 = btVector3::y(&local_60);
    local_4c = *pbVar1 + local_4c;
  }
  else {
    pbVar1 = btVector3::y(&local_60);
    local_40 = *pbVar1 + local_40;
  }
  pbVar1 = btVector3::z(&local_60);
  if (*pbVar1 <= 0.0) {
    pbVar1 = btVector3::z(&local_60);
    local_50 = *pbVar1 + local_50;
  }
  else {
    pbVar1 = btVector3::z(&local_60);
    local_44 = *pbVar1 + local_44;
  }
  bVar2 = btVector3::length((btVector3 *)0x1abccc);
  fVar3 = (float)(**(code **)(*in_RDI + 0x20))();
  local_64 = bVar2 * fVar3 * local_24;
  btVector3::btVector3(&local_74,&local_64,&local_64,&local_64);
  btVector3::btVector3(&local_84,&local_48,&local_4c,&local_50);
  *(undefined8 *)local_30->m_floats = local_84.m_floats._0_8_;
  *(undefined8 *)(local_30->m_floats + 2) = local_84.m_floats._8_8_;
  btVector3::btVector3((btVector3 *)&stack0xffffffffffffff6c,&local_3c,&local_40,&local_44);
  *(ulong *)local_38->m_floats = CONCAT44(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  *(ulong *)(local_38->m_floats + 2) = CONCAT44(bStack_88,in_stack_ffffffffffffff74);
  btVector3::operator-=(local_30,&local_74);
  btVector3::operator+=(local_38,&local_74);
  return;
}

Assistant:

void btCollisionShape::calculateTemporalAabb(const btTransform& curTrans,const btVector3& linvel,const btVector3& angvel,btScalar timeStep, btVector3& temporalAabbMin,btVector3& temporalAabbMax) const
{
	//start with static aabb
	getAabb(curTrans,temporalAabbMin,temporalAabbMax);

	btScalar temporalAabbMaxx = temporalAabbMax.getX();
	btScalar temporalAabbMaxy = temporalAabbMax.getY();
	btScalar temporalAabbMaxz = temporalAabbMax.getZ();
	btScalar temporalAabbMinx = temporalAabbMin.getX();
	btScalar temporalAabbMiny = temporalAabbMin.getY();
	btScalar temporalAabbMinz = temporalAabbMin.getZ();

	// add linear motion
	btVector3 linMotion = linvel*timeStep;
	///@todo: simd would have a vector max/min operation, instead of per-element access
	if (linMotion.x() > btScalar(0.))
		temporalAabbMaxx += linMotion.x(); 
	else
		temporalAabbMinx += linMotion.x();
	if (linMotion.y() > btScalar(0.))
		temporalAabbMaxy += linMotion.y(); 
	else
		temporalAabbMiny += linMotion.y();
	if (linMotion.z() > btScalar(0.))
		temporalAabbMaxz += linMotion.z(); 
	else
		temporalAabbMinz += linMotion.z();

	//add conservative angular motion
	btScalar angularMotion = angvel.length() * getAngularMotionDisc() * timeStep;
	btVector3 angularMotion3d(angularMotion,angularMotion,angularMotion);
	temporalAabbMin = btVector3(temporalAabbMinx,temporalAabbMiny,temporalAabbMinz);
	temporalAabbMax = btVector3(temporalAabbMaxx,temporalAabbMaxy,temporalAabbMaxz);

	temporalAabbMin -= angularMotion3d;
	temporalAabbMax += angularMotion3d;
}